

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::AssertionResult::swap(AssertionResult *this,AssertionResult *other)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  
  bVar1 = this->success_;
  this->success_ = other->success_;
  other->success_ = bVar1;
  pbVar2 = (this->message_).ptr_;
  (this->message_).ptr_ = (other->message_).ptr_;
  (other->message_).ptr_ = pbVar2;
  return;
}

Assistant:

void AssertionResult::swap(AssertionResult& other) {
  using std::swap;
  swap(success_, other.success_);
  swap(message_, other.message_);
}